

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseException.cpp
# Opt level: O1

void __thiscall
rc::detail::ParseException::ParseException(ParseException *this,size_type pos,string *msg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  ulong __val;
  bool bVar3;
  long lVar4;
  char cVar5;
  long *plVar6;
  ulong uVar7;
  long *plVar8;
  size_type *psVar9;
  char cVar10;
  string __str;
  char *local_90;
  uint local_88;
  char local_80 [16];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  *(undefined ***)this = &PTR__ParseException_001b5278;
  this->m_pos = pos;
  (this->m_msg)._M_dataplus._M_p = (pointer)&(this->m_msg).field_2;
  pcVar2 = (msg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_msg,pcVar2,pcVar2 + msg->_M_string_length);
  __val = this->m_pos;
  cVar10 = '\x01';
  if (9 < __val) {
    uVar7 = __val;
    cVar5 = '\x04';
    do {
      cVar10 = cVar5;
      if (uVar7 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_0016ec32;
      }
      if (uVar7 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_0016ec32;
      }
      if (uVar7 < 10000) goto LAB_0016ec32;
      bVar3 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      cVar5 = cVar10 + '\x04';
    } while (bVar3);
    cVar10 = cVar10 + '\x01';
  }
LAB_0016ec32:
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_90,local_88,__val);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x186b6e);
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_60 = *plVar8;
    lStack_58 = plVar6[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar8;
    local_70 = (long *)*plVar6;
  }
  local_68 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_40 = *plVar8;
    lStack_38 = plVar6[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar8;
    local_50 = (long *)*plVar6;
  }
  local_48 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)(msg->_M_dataplus)._M_p)
  ;
  paVar1 = &(this->m_what).field_2;
  (this->m_what)._M_dataplus._M_p = (pointer)paVar1;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar9) {
    lVar4 = plVar6[3];
    paVar1->_M_allocated_capacity = *psVar9;
    *(long *)((long)&(this->m_what).field_2 + 8) = lVar4;
  }
  else {
    (this->m_what)._M_dataplus._M_p = (pointer)*plVar6;
    (this->m_what).field_2._M_allocated_capacity = *psVar9;
  }
  (this->m_what)._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  return;
}

Assistant:

ParseException::ParseException(std::string::size_type pos,
                               const std::string &msg)
    : m_pos(pos)
    , m_msg(msg)
    , m_what("@" + std::to_string(m_pos) + ": " + msg) {}